

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel-posix.cpp
# Opt level: O2

void __thiscall Dashel::SerialStream::SerialStream(SerialStream *this,string *targetName)

{
  bool bVar1;
  int iVar2;
  string *psVar3;
  long lVar4;
  _Base_ptr p_Var5;
  iterator iVar6;
  ostream *poVar7;
  int *piVar8;
  DashelException *pDVar9;
  uint uVar10;
  _Self __tmp;
  uint uVar11;
  uint uVar12;
  int iFlags;
  string name;
  string devFileName;
  map<int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ports;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ports,"ser",(allocator<char> *)&name);
  Stream::Stream((Stream *)&this->field_0x1060,(string *)&ports);
  std::__cxx11::string::~string((string *)&ports);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ports,"ser",(allocator<char> *)&name);
  FileDescriptorStream::FileDescriptorStream
            ((FileDescriptorStream *)this,&PTR_construction_vtable_24__001260a8,(string *)&ports);
  std::__cxx11::string::~string((string *)&ports);
  *(undefined ***)this = &PTR__SerialStream_00126010;
  *(undefined ***)&this->field_0x1060 = &PTR__SerialStream_00126078;
  ParameterSet::add((ParameterSet *)&this->field_0x1090,
                    "ser:port=1;baud=115200;stop=1;parity=none;fc=none;bits=8;dtr=true");
  ParameterSet::add((ParameterSet *)(&this->field_0x30 + *(long *)(*(long *)this + -0x18)),
                    (targetName->_M_dataplus)._M_p);
  devFileName._M_dataplus._M_p = (pointer)&devFileName.field_2;
  devFileName._M_string_length = 0;
  devFileName.field_2._M_local_buf[0] = '\0';
  bVar1 = ParameterSet::isSet((ParameterSet *)(&this->field_0x30 + *(long *)(*(long *)this + -0x18))
                              ,"device");
  if (bVar1) {
    ParameterSet::addParam
              ((ParameterSet *)(&this->field_0x30 + *(long *)(*(long *)this + -0x18)),"device",
               (char *)0x0,true);
    ParameterSet::erase((ParameterSet *)(&this->field_0x30 + *(long *)(*(long *)this + -0x18)),
                        "port");
    ParameterSet::erase((ParameterSet *)(&this->field_0x30 + *(long *)(*(long *)this + -0x18)),
                        "name");
    ParameterSet::get_abi_cxx11_
              ((ParameterSet *)(&this->field_0x30 + *(long *)(*(long *)this + -0x18)),"device");
    std::__cxx11::string::_M_assign((string *)&devFileName);
  }
  else {
    bVar1 = ParameterSet::isSet((ParameterSet *)
                                (&this->field_0x30 + *(long *)(*(long *)this + -0x18)),"name");
    if (bVar1) {
      ParameterSet::addParam
                ((ParameterSet *)(&this->field_0x30 + *(long *)(*(long *)this + -0x18)),"name",
                 (char *)0x0,true);
      ParameterSet::erase((ParameterSet *)(&this->field_0x30 + *(long *)(*(long *)this + -0x18)),
                          "port");
      ParameterSet::erase((ParameterSet *)(&this->field_0x30 + *(long *)(*(long *)this + -0x18)),
                          "device");
      psVar3 = ParameterSet::get_abi_cxx11_
                         ((ParameterSet *)(&this->field_0x30 + *(long *)(*(long *)this + -0x18)),
                          "name");
      std::__cxx11::string::string((string *)&name,(string *)psVar3);
      SerialPortEnumerator::getPorts_abi_cxx11_();
      for (p_Var5 = ports._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var5 != &ports._M_t._M_impl.super__Rb_tree_header;
          p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
        lVar4 = std::__cxx11::string::find((string *)&p_Var5[2]._M_parent,(ulong)&name);
        if (lVar4 != -1) {
          std::__cxx11::string::_M_assign((string *)&devFileName);
          poVar7 = std::operator<<((ostream *)&std::cout,"Found ");
          poVar7 = std::operator<<(poVar7,(string *)&name);
          poVar7 = std::operator<<(poVar7," on port ");
          poVar7 = std::operator<<(poVar7,(string *)&devFileName);
          std::endl<char,std::char_traits<char>>(poVar7);
          break;
        }
      }
      if (devFileName._M_string_length == 0) {
        pDVar9 = (DashelException *)__cxa_allocate_exception(0x20);
        DashelException::DashelException
                  (pDVar9,ConnectionFailed,0,
                   "The specified name could not be find among the serial ports.",(Stream *)0x0);
        __cxa_throw(pDVar9,&DashelException::typeinfo,std::runtime_error::~runtime_error);
      }
      std::
      _Rb_tree<int,_std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~_Rb_tree(&ports._M_t);
      std::__cxx11::string::~string((string *)&name);
    }
    else {
      ParameterSet::erase((ParameterSet *)(&this->field_0x30 + *(long *)(*(long *)this + -0x18)),
                          "device");
      ParameterSet::erase((ParameterSet *)(&this->field_0x30 + *(long *)(*(long *)this + -0x18)),
                          "name");
      SerialPortEnumerator::getPorts_abi_cxx11_();
      name._M_dataplus._M_p._0_4_ =
           ParameterSet::get<int>
                     ((ParameterSet *)(&this->field_0x30 + *(long *)(*(long *)this + -0x18)),"port")
      ;
      iVar6 = std::
              _Rb_tree<int,_std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::find(&ports._M_t,(key_type *)&name);
      if ((_Rb_tree_header *)iVar6._M_node == &ports._M_t._M_impl.super__Rb_tree_header) {
        pDVar9 = (DashelException *)__cxa_allocate_exception(0x20);
        DashelException::DashelException
                  (pDVar9,ConnectionFailed,0,"The specified serial port does not exists.",
                   (Stream *)0x0);
        __cxa_throw(pDVar9,&DashelException::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::string::operator=((string *)&devFileName,(char)iVar6._M_node[1]._M_color);
      std::
      _Rb_tree<int,_std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~_Rb_tree(&ports._M_t);
    }
  }
  uVar10 = 2;
  iVar2 = open(devFileName._M_dataplus._M_p,2);
  *(int *)&this->field_0x8 = iVar2;
  if (iVar2 == -1) {
    pDVar9 = (DashelException *)__cxa_allocate_exception(0x20);
    piVar8 = __errno_location();
    DashelException::DashelException
              (pDVar9,ConnectionFailed,*piVar8,"Cannot open serial port.",(Stream *)0x0);
    __cxa_throw(pDVar9,&DashelException::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar2 = flock(iVar2,6);
  if (iVar2 != 0) {
    close(*(int *)&this->field_0x8);
    pDVar9 = (DashelException *)__cxa_allocate_exception(0x20);
    piVar8 = __errno_location();
    DashelException::DashelException
              (pDVar9,ConnectionFailed,*piVar8,"Cannot lock serial port.",(Stream *)0x0);
    __cxa_throw(pDVar9,&DashelException::typeinfo,std::runtime_error::~runtime_error);
  }
  tcgetattr(*(int *)&this->field_0x8,(termios *)&this->oldtio);
  name._M_dataplus._M_p = (pointer)0x0;
  name.field_2._M_allocated_capacity = 0;
  name.field_2._8_8_ = 0;
  name._M_string_length = 0x880;
  iVar2 = ParameterSet::get<int>
                    ((ParameterSet *)(&this->field_0x30 + *(long *)(*(long *)this + -0x18)),"bits");
  switch(iVar2) {
  case 5:
    uVar12 = 0x880;
    goto LAB_00118e4a;
  case 6:
    uVar12 = 0x890;
    break;
  case 7:
    uVar12 = 0x8a0;
    break;
  case 8:
    uVar12 = 0x8b0;
    break;
  default:
    pDVar9 = (DashelException *)__cxa_allocate_exception(0x20);
    DashelException::DashelException
              (pDVar9,InvalidTarget,0,"Invalid number of bits per character, must be 5, 6, 7, or 8."
               ,(Stream *)0x0);
    goto LAB_0011926a;
  }
  name._M_string_length = CONCAT44(name._M_string_length._4_4_,uVar12);
LAB_00118e4a:
  psVar3 = ParameterSet::get_abi_cxx11_
                     ((ParameterSet *)(&this->field_0x30 + *(long *)(*(long *)this + -0x18)),"stop")
  ;
  bVar1 = std::operator==(psVar3,"2");
  uVar11 = uVar12;
  if (bVar1) {
    uVar11 = uVar12 | 0x40;
    name._M_string_length = CONCAT44(name._M_string_length._4_4_,uVar12) | 0x40;
  }
  psVar3 = ParameterSet::get_abi_cxx11_
                     ((ParameterSet *)(&this->field_0x30 + *(long *)(*(long *)this + -0x18)),"fc");
  bVar1 = std::operator==(psVar3,"hard");
  uVar12 = uVar11;
  if (bVar1) {
    uVar12 = uVar11 | 0x80000000;
    name._M_string_length = CONCAT44(name._M_string_length._4_4_,uVar11) | 0x80000000;
  }
  psVar3 = ParameterSet::get_abi_cxx11_
                     ((ParameterSet *)(&this->field_0x30 + *(long *)(*(long *)this + -0x18)),
                      "parity");
  bVar1 = std::operator!=(psVar3,"none");
  uVar11 = uVar12;
  if (bVar1) {
    name._M_string_length = CONCAT44(name._M_string_length._4_4_,uVar12) | 0x100;
    psVar3 = ParameterSet::get_abi_cxx11_
                       ((ParameterSet *)(&this->field_0x30 + *(long *)(*(long *)this + -0x18)),
                        "parity");
    bVar1 = std::operator==(psVar3,"odd");
    uVar11 = uVar12 | 0x100;
    if (bVar1) {
      uVar11 = uVar12 | 0x300;
      name._M_string_length = CONCAT44(name._M_string_length._4_4_,uVar12) | 0x300;
    }
  }
  iVar2 = ParameterSet::get<int>
                    ((ParameterSet *)(&this->field_0x30 + *(long *)(*(long *)this + -0x18)),"baud");
  if (iVar2 != 0) {
    if (iVar2 == 0x32) {
      uVar10 = 1;
    }
    else if (iVar2 == 4000000) {
      uVar10 = 0x100f;
    }
    else if (iVar2 == 0x6e) {
      uVar10 = 3;
    }
    else if (iVar2 == 0x86) {
      uVar10 = 4;
    }
    else if (iVar2 == 0x96) {
      uVar10 = 5;
    }
    else if (iVar2 == 200) {
      uVar10 = 6;
    }
    else if (iVar2 == 300) {
      uVar10 = 7;
    }
    else if (iVar2 == 600) {
      uVar10 = 8;
    }
    else if (iVar2 == 0x4b0) {
      uVar10 = 9;
    }
    else if (iVar2 == 0x708) {
      uVar10 = 10;
    }
    else if (iVar2 == 0x960) {
      uVar10 = 0xb;
    }
    else if (iVar2 == 0x12c0) {
      uVar10 = 0xc;
    }
    else if (iVar2 == 0x2580) {
      uVar10 = 0xd;
    }
    else if (iVar2 == 0x4b00) {
      uVar10 = 0xe;
    }
    else if (iVar2 == 0x9600) {
      uVar10 = 0xf;
    }
    else if (iVar2 == 0xe100) {
      uVar10 = 0x1001;
    }
    else if (iVar2 == 0x1c200) {
      uVar10 = 0x1002;
    }
    else if (iVar2 == 0x38400) {
      uVar10 = 0x1003;
    }
    else if (iVar2 == 0x70800) {
      uVar10 = 0x1004;
    }
    else if (iVar2 == 500000) {
      uVar10 = 0x1005;
    }
    else if (iVar2 == 0x8ca00) {
      uVar10 = 0x1006;
    }
    else if (iVar2 == 0xe1000) {
      uVar10 = 0x1007;
    }
    else if (iVar2 == 1000000) {
      uVar10 = 0x1008;
    }
    else if (iVar2 == 0x119400) {
      uVar10 = 0x1009;
    }
    else if (iVar2 == 1500000) {
      uVar10 = 0x100a;
    }
    else if (iVar2 == 2000000) {
      uVar10 = 0x100b;
    }
    else if (iVar2 == 2500000) {
      uVar10 = 0x100c;
    }
    else if (iVar2 == 3000000) {
      uVar10 = 0x100d;
    }
    else if (iVar2 == 3500000) {
      uVar10 = 0x100e;
    }
    else if (iVar2 != 0x4b) {
      pDVar9 = (DashelException *)__cxa_allocate_exception(0x20);
      DashelException::DashelException(pDVar9,ConnectionFailed,0,"Invalid baud rate.",(Stream *)0x0)
      ;
      goto LAB_0011926a;
    }
    name._M_string_length = (size_type)(uVar11 | uVar10);
  }
  name._M_dataplus._M_p = (pointer)0x4;
  name._M_string_length = name._M_string_length & 0xffffffff;
  name.field_2._M_allocated_capacity._6_2_ = 0x100;
  iVar2 = tcflush(*(int *)&this->field_0x8,2);
  if ((-1 < iVar2) && (iVar2 = tcsetattr(*(int *)&this->field_0x8,0,(termios *)&name), -1 < iVar2))
  {
    iFlags = 2;
    bVar1 = ParameterSet::get<bool>
                      ((ParameterSet *)(&this->field_0x30 + *(long *)(*(long *)this + -0x18)),"dtr")
    ;
    ioctl(*(int *)&this->field_0x8,(ulong)bVar1 ^ 0x5417,&iFlags);
    memset(&ports._M_t._M_impl.super__Rb_tree_header,0,0x90);
    ports._M_t._M_impl._0_8_ = 1;
    sigaction(1,(sigaction *)&ports,(sigaction *)0x0);
    std::__cxx11::string::~string((string *)&devFileName);
    return;
  }
  pDVar9 = (DashelException *)__cxa_allocate_exception(0x20);
  DashelException::DashelException
            (pDVar9,ConnectionFailed,0,
             "Cannot setup serial port. The requested baud rate might not be supported.",
             (Stream *)0x0);
LAB_0011926a:
  __cxa_throw(pDVar9,&DashelException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

explicit SerialStream(const string& targetName) :
			Stream("ser"),
			FileDescriptorStream("ser")
		{
			target.add("ser:port=1;baud=115200;stop=1;parity=none;fc=none;bits=8;dtr=true");
			target.add(targetName.c_str());
			string devFileName;

			if (target.isSet("device"))
			{
				target.addParam("device", NULL, true);
				target.erase("port");
				target.erase("name");

				devFileName = target.get("device");
			}
			else if (target.isSet("name"))
			{
				target.addParam("name", NULL, true);
				target.erase("port");
				target.erase("device");

				// Enumerates the ports
				std::string name = target.get("name");
				std::map<int, std::pair<std::string, std::string> > ports = SerialPortEnumerator::getPorts();

				// Iterate on all ports to found one with "name" in its description
				std::map<int, std::pair<std::string, std::string> >::iterator it;
				for (it = ports.begin(); it != ports.end(); it++)
				{
					if (it->second.second.find(name) != std::string::npos)
					{
						devFileName = it->second.first;
						std::cout << "Found " << name << " on port " << devFileName << std::endl;
						break;
					}
				}
				if (devFileName.size() == 0)
					throw DashelException(DashelException::ConnectionFailed, 0, "The specified name could not be find among the serial ports.");
			}
			else // port
			{
				target.erase("device");
				target.erase("name");

				std::map<int, std::pair<std::string, std::string> > ports = SerialPortEnumerator::getPorts();
				std::map<int, std::pair<std::string, std::string> >::const_iterator it = ports.find(target.get<int>("port"));
				if (it != ports.end())
				{
					devFileName = it->first;
				}
				else
					throw DashelException(DashelException::ConnectionFailed, 0, "The specified serial port does not exists.");
			}

			fd = open(devFileName.c_str(), O_RDWR);
			if (fd == -1)
				throw DashelException(DashelException::ConnectionFailed, errno, "Cannot open serial port.");

			int lockRes = flock(fd, LOCK_EX | LOCK_NB);
			if (lockRes != 0)
			{
				close(fd);
				throw DashelException(DashelException::ConnectionFailed, errno, "Cannot lock serial port.");
			}

			struct termios newtio;

			// save old serial port state and clear new one
			tcgetattr(fd, &oldtio);
			memset(&newtio, 0, sizeof(newtio));

			newtio.c_cflag |= CLOCAL; // ignore modem control lines.
			newtio.c_cflag |= CREAD; // enable receiver.
			switch (target.get<int>("bits")) // Set amount of bits per character
			{
				case 5: newtio.c_cflag |= CS5; break;
				case 6: newtio.c_cflag |= CS6; break;
				case 7: newtio.c_cflag |= CS7; break;
				case 8: newtio.c_cflag |= CS8; break;
				default: throw DashelException(DashelException::InvalidTarget, 0, "Invalid number of bits per character, must be 5, 6, 7, or 8.");
			}
			if (target.get("stop") == "2")
				newtio.c_cflag |= CSTOPB; // Set two stop bits, rather than one.
			if (target.get("fc") == "hard")
				newtio.c_cflag |= CRTSCTS; // enable hardware flow control
			if (target.get("parity") != "none")
			{
				newtio.c_cflag |= PARENB; // enable parity generation on output and parity checking for input.
				if (target.get("parity") == "odd")
					newtio.c_cflag |= PARODD; // parity for input and output is odd.
			}

#ifdef MACOSX
			if (cfsetspeed(&newtio, target.get<int>("baud")) != 0)
				throw DashelException(DashelException::ConnectionFailed, errno, "Invalid baud rate.");
#else
			switch (target.get<int>("baud"))
			{
				case 0: newtio.c_cflag |= B0; break;
				case 50: newtio.c_cflag |= B50; break;
				case 75: newtio.c_cflag |= B75; break;
				case 110: newtio.c_cflag |= B110; break;
				case 134: newtio.c_cflag |= B134; break;
				case 150: newtio.c_cflag |= B150; break;
				case 200: newtio.c_cflag |= B200; break;
				case 300: newtio.c_cflag |= B300; break;
				case 600: newtio.c_cflag |= B600; break;
				case 1200: newtio.c_cflag |= B1200; break;
				case 1800: newtio.c_cflag |= B1800; break;
				case 2400: newtio.c_cflag |= B2400; break;
				case 4800: newtio.c_cflag |= B4800; break;
				case 9600: newtio.c_cflag |= B9600; break;
				case 19200: newtio.c_cflag |= B19200; break;
				case 38400: newtio.c_cflag |= B38400; break;
				case 57600: newtio.c_cflag |= B57600; break;
				case 115200: newtio.c_cflag |= B115200; break;
				case 230400: newtio.c_cflag |= B230400; break;
				case 460800: newtio.c_cflag |= B460800; break;
				case 500000: newtio.c_cflag |= B500000; break;
				case 576000: newtio.c_cflag |= B576000; break;
				case 921600: newtio.c_cflag |= B921600; break;
				case 1000000: newtio.c_cflag |= B1000000; break;
				case 1152000: newtio.c_cflag |= B1152000; break;
				case 1500000: newtio.c_cflag |= B1500000; break;
				case 2000000: newtio.c_cflag |= B2000000; break;
#ifdef B2500000
				case 2500000: newtio.c_cflag |= B2500000; break;
#endif // B2500000
#ifdef B3000000
				case 3000000: newtio.c_cflag |= B3000000; break;
#endif // B3000000
#ifdef B3500000
				case 3500000: newtio.c_cflag |= B3500000; break;
#endif // B3500000
#ifdef B4000000
				case 4000000: newtio.c_cflag |= B4000000; break;
#endif // B4000000
				default: throw DashelException(DashelException::ConnectionFailed, 0, "Invalid baud rate.");
			}
#endif

			newtio.c_iflag = IGNPAR; // ignore parity on input

			newtio.c_oflag = 0;

			newtio.c_lflag = 0;

			newtio.c_cc[VTIME] = 0; // block forever if no byte
			newtio.c_cc[VMIN] = 1; // one byte is sufficient to return

			// set attributes
			if ((tcflush(fd, TCIOFLUSH) < 0) || (tcsetattr(fd, TCSANOW, &newtio) < 0))
				throw DashelException(DashelException::ConnectionFailed, 0, "Cannot setup serial port. The requested baud rate might not be supported.");

			// Enable or disable DTR
			int iFlags = TIOCM_DTR;
			if (target.get<bool>("dtr"))
				ioctl(fd, TIOCMBIS, &iFlags);
			else
				ioctl(fd, TIOCMBIC, &iFlags);

			//Ignore SIGHUP from this point ownward, as it may be emitted and lead to a crash on some POSIX
			//implementations, despite CLOCAL being set
			//TODO: we should probably reset the signal to its initial state when all devices are disconnected.
			struct sigaction act;
			memset(&act, 0, sizeof(act));
			act.sa_handler = SIG_IGN;
			sigaction(SIGHUP, &act, NULL);
		}